

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

uint rlLoadShaderProgram(uint vShaderId,uint fShaderId)

{
  GLint GVar1;
  GLuint GVar2;
  GLchar *__ptr;
  GLuint GVar3;
  int length;
  int maxLength;
  GLint success;
  GLsizei local_34;
  GLint local_30;
  GLint local_2c;
  
  local_2c = 0;
  GVar2 = (*glad_glCreateProgram)();
  (*glad_glAttachShader)(GVar2,vShaderId);
  (*glad_glAttachShader)(GVar2,fShaderId);
  (*glad_glBindAttribLocation)(GVar2,0,"vertexPosition");
  (*glad_glBindAttribLocation)(GVar2,1,"vertexTexCoord");
  (*glad_glBindAttribLocation)(GVar2,2,"vertexNormal");
  (*glad_glBindAttribLocation)(GVar2,3,"vertexColor");
  (*glad_glBindAttribLocation)(GVar2,4,"vertexTangent");
  (*glad_glBindAttribLocation)(GVar2,5,"vertexTexCoord2");
  (*glad_glLinkProgram)(GVar2);
  (*glad_glGetProgramiv)(GVar2,0x8b82,&local_2c);
  if (local_2c == 0) {
    GVar3 = 0;
    TraceLog(4,"SHADER: [ID %i] Failed to link shader program",(ulong)GVar2);
    local_30 = 0;
    (*glad_glGetProgramiv)(GVar2,0x8b84,&local_30);
    GVar1 = local_30;
    if (0 < (long)local_30) {
      local_34 = 0;
      __ptr = (GLchar *)calloc((long)local_30,1);
      (*glad_glGetProgramInfoLog)(GVar2,GVar1,&local_34,__ptr);
      TraceLog(4,"SHADER: [ID %i] Link error: %s",(ulong)GVar2,__ptr);
      free(__ptr);
    }
    (*glad_glDeleteProgram)(GVar2);
  }
  else {
    TraceLog(3,"SHADER: [ID %i] Program shader loaded successfully",(ulong)GVar2);
    GVar3 = GVar2;
  }
  return GVar3;
}

Assistant:

unsigned int rlLoadShaderProgram(unsigned int vShaderId, unsigned int fShaderId)
{
    unsigned int program = 0;

#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    GLint success = 0;
    program = glCreateProgram();

    glAttachShader(program, vShaderId);
    glAttachShader(program, fShaderId);

    // NOTE: Default attribute shader locations must be binded before linking
    glBindAttribLocation(program, 0, DEFAULT_SHADER_ATTRIB_NAME_POSITION);
    glBindAttribLocation(program, 1, DEFAULT_SHADER_ATTRIB_NAME_TEXCOORD);
    glBindAttribLocation(program, 2, DEFAULT_SHADER_ATTRIB_NAME_NORMAL);
    glBindAttribLocation(program, 3, DEFAULT_SHADER_ATTRIB_NAME_COLOR);
    glBindAttribLocation(program, 4, DEFAULT_SHADER_ATTRIB_NAME_TANGENT);
    glBindAttribLocation(program, 5, DEFAULT_SHADER_ATTRIB_NAME_TEXCOORD2);

    // NOTE: If some attrib name is no found on the shader, it locations becomes -1

    glLinkProgram(program);

    // NOTE: All uniform variables are intitialised to 0 when a program links

    glGetProgramiv(program, GL_LINK_STATUS, &success);

    if (success == GL_FALSE)
    {
        TRACELOG(LOG_WARNING, "SHADER: [ID %i] Failed to link shader program", program);

        int maxLength = 0;
        glGetProgramiv(program, GL_INFO_LOG_LENGTH, &maxLength);

        if (maxLength > 0)
        {
            int length = 0;
            char *log = RL_CALLOC(maxLength, sizeof(char));
            glGetProgramInfoLog(program, maxLength, &length, log);
            TRACELOG(LOG_WARNING, "SHADER: [ID %i] Link error: %s", program, log);
            RL_FREE(log);
        }

        glDeleteProgram(program);

        program = 0;
    }
    else TRACELOG(LOG_INFO, "SHADER: [ID %i] Program shader loaded successfully", program);
#endif
    return program;
}